

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

Ref cashew::ValueBuilder::makeCall(Ref target,Ref arg)

{
  Value *pVVar1;
  Ref RVar2;
  Ref *this;
  Ref local_28;
  Ref local_20;
  Ref arg_local;
  Ref target_local;
  Ref ret;
  
  local_20.inst = arg.inst;
  arg_local = target;
  local_28 = makeRawArray(3);
  pVVar1 = Ref::operator->(&local_28);
  RVar2 = makeRawString((IString *)CALL);
  pVVar1 = cashew::Value::push_back(pVVar1,RVar2);
  pVVar1 = cashew::Value::push_back(pVVar1,arg_local);
  RVar2 = makeRawArray(0);
  pVVar1 = cashew::Value::push_back(pVVar1,RVar2);
  Ref::Ref(&target_local,pVVar1);
  this = Ref::operator[](&target_local,2);
  pVVar1 = Ref::operator->(this);
  cashew::Value::push_back(pVVar1,local_20);
  return (Ref)target_local.inst;
}

Assistant:

static Ref makeCall(Ref target, Ref arg) {
    Ref ret = &makeRawArray(3)
                 ->push_back(makeRawString(CALL))
                 .push_back(target)
                 .push_back(makeRawArray());
    ret[2]->push_back(arg);
    return ret;
  }